

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ProtobufPrinter::PrintValue<google::protobuf::Field,void>
               (Field *value,ostream *os)

{
  undefined8 uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string pretty_str;
  ostream *os_local;
  Field *value_local;
  
  pretty_str.field_2._8_8_ = os;
  google::protobuf::Message::ShortDebugString_abi_cxx11_((string *)local_38,&value->super_Message);
  uVar2 = std::__cxx11::string::length();
  if (0x32 < uVar2) {
    google::protobuf::Message::DebugString_abi_cxx11_(&local_78,&value->super_Message);
    std::operator+(&local_58,"\n",&local_78);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  uVar1 = pretty_str.field_2._8_8_;
  std::operator+(&local_c8,"<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_a8,&local_c8,">");
  std::operator<<((ostream *)uVar1,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    std::string pretty_str = value.ShortDebugString();
    if (pretty_str.length() > kProtobufOneLinerMaxLength) {
      pretty_str = "\n" + value.DebugString();
    }
    *os << ("<" + pretty_str + ">");
  }